

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVector.cpp
# Opt level: O2

string * __thiscall
AlphaVector::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,AlphaVector *this)

{
  ostream *poVar1;
  double *pdVar2;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"a ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," bI ");
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  std::operator<<(poVar1," : values");
  for (pdVar2 = (this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != (this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    std::operator<<(local_1a0," ");
    std::ostream::_M_insert<double>(*pdVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string AlphaVector::SoftPrint() const
{
    stringstream ss;
    ss << "a " << _m_action << " bI " << _m_betaI
       << " : values";
    vector<double>::const_iterator it=_m_values.begin();
    while(it!=_m_values.end())
    {
        ss << " " << *it;
        it++;
    }
    return(ss.str());
}